

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelInstance.cpp
# Opt level: O1

void __thiscall ModelInstance::assign(ModelInstance *this)

{
  void *pvVar1;
  pointer pfVar2;
  pointer piVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float in_stack_000014e8;
  Topology in_stack_000014fc;
  allocator_type local_4d;
  value_type_conflict2 local_4c;
  vector<int,_std::allocator<int>_> local_48 [2];
  
  memcpy(&this->network,&stack0x00000008,0x14e4);
  this->position = (this->network).mismatchsite;
  this->state = 1;
  this->dt_react = in_stack_000014e8;
  this->dt_diff = 0.0001;
  this->totaltime = 300.0;
  updateStep(this);
  this->nick1 = -1.0;
  this->nick2 = -1.0;
  this->currenttime = 0.0;
  this->passed_mismatch = false;
  this->p_activate = 1.0;
  this->topology = in_stack_000014fc;
  lVar5 = 0;
  do {
    *(undefined8 *)
     ((long)&local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5) = 0;
    *(undefined8 *)
     ((long)&local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar5) = 0;
    *(undefined8 *)
     ((long)&local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar5) = 0;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x30);
  lVar5 = 0;
  do {
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              ((vector<float,_std::allocator<float>_> *)
               ((long)&(this->dimersactive)._M_elems[0].
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5),
               (long)&local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar5);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x30);
  lVar5 = 0x18;
  do {
    pvVar1 = *(void **)((long)&local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  pfVar2 = (this->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2);
  }
  fVar6 = this->totaltime / this->dt_react;
  uVar4 = (ulong)fVar6;
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (local_48,(long)(fVar6 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4,&local_4c,&local_4d
            );
  piVar3 = (this->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  if (local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ModelInstance::assign(NetworkArray net, ParameterObj par) {
	network = net;
	position = network.mismatchsite;	// starting position and mismatch position must be the same
	state = 1;						// graph is symmetric, so let all start in state 1
	dt_react = net.dt_react; 						// for reaction, check dt with networkarray for probabilities
	dt_diff = 100e-6;				// for diffusion
	totaltime = 300;
	updateStep();
	nick1 = -1;
	nick2 = -1;
	currenttime = 0;
	passed_mismatch = false;
	p_activate = 1;
	topology = par.top;

	dimersactive = std::array<std::vector<float>, 2> {};
	homotetramer = std::vector<float>{};
	states = std::vector<int>(totaltime/dt_react, 0);
}